

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::Optimize(dgPolyhedra *this,HaF64 *array,HaI32 strideInBytes,HaF64 tol)

{
  dgEdgeCollapseEdgeHandle *element;
  int iVar1;
  HaI32 HVar2;
  HaI32 HVar3;
  HaI32 i2;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  dgRedBackNode *pdVar7;
  uint size;
  HaI32 HVar8;
  dgBigVector *pdVar9;
  dgVertexCollapseVertexMetric *pdVar10;
  dgListNode **ppdVar11;
  dgEdge *pdVar12;
  dgTreeNode *pdVar13;
  dgEdge *pdVar14;
  dgEdge *pdVar15;
  dgPolyhedra *pdVar16;
  long lVar17;
  HaF64 *pHVar18;
  dgEdge *pdVar19;
  HaF64 HVar20;
  dgListNode *handleNodePtr;
  dgStack<dgBigVector> vertexPool;
  dgEdgeCollapseEdgeHandle handle_1;
  dgStack<dgVertexCollapseVertexMetric> vertexMetrics;
  dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> bigHeapArray;
  Iterator iter;
  dgBigPlane constrainPlane;
  dgList<dgEdgeCollapseEdgeHandle> edgeHandleList;
  dgStack<char> heapPool;
  dgVertexCollapseVertexMetric tmp;
  dgEdge *local_168;
  dgListNode *local_158;
  dgBigVector *local_150;
  undefined1 local_148 [32];
  dgEdge *local_128;
  dgStack<dgVertexCollapseVertexMetric> local_120;
  dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> local_110;
  Iterator local_100;
  double local_f0;
  dgBigPlane local_e8;
  dgList<dgEdgeCollapseEdgeHandle> local_c0;
  dgEdge *local_a0;
  dgStack<char> local_98;
  dgVertexCollapseVertexMetric local_88;
  
  iVar1 = (this->super_dgTree<dgEdge,_long>).m_count;
  local_148._16_8_ = this;
  size = GetLastVertexIndex(this);
  dgStack<dgBigVector>::dgStack((dgStack<dgBigVector> *)local_148,size);
  dgStack<dgVertexCollapseVertexMetric>::dgStack(&local_120,size + 0x200);
  local_c0._vptr_dgList = (_func_int **)&PTR__dgList_0118eaf8;
  local_c0.m_count = 0;
  local_c0.m_last = (dgListNode *)0x0;
  local_c0.m_first = (dgListNode *)0x0;
  dgStack<char>::dgStack(&local_98,iVar1 * 0xa0 + 0xa0000);
  local_110.m_pool = (RECORD *)dgStack<char>::operator[](&local_98,0);
  local_110.m_maxCount = local_98.m_size >> 4;
  local_110.m_curCount = 0;
  pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
  pHVar18 = array + 2;
  for (lVar17 = 0; (ulong)(~((int)size >> 0x1f) & size) << 5 != lVar17; lVar17 = lVar17 + 0x20) {
    *(HaF64 *)((long)&(pdVar9->super_dgTemplateVector<double>).m_x + lVar17) = pHVar18[-2];
    *(HaF64 *)((long)&(pdVar9->super_dgTemplateVector<double>).m_y + lVar17) = pHVar18[-1];
    HVar20 = *pHVar18;
    pHVar18 = pHVar18 + (strideInBytes >> 3);
    *(HaF64 *)((long)&(pdVar9->super_dgTemplateVector<double>).m_z + lVar17) = HVar20;
    *(undefined8 *)((long)&(pdVar9->super_dgTemplateVector<double>).m_w + lVar17) = 0;
  }
  pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,0);
  memset(pdVar10,0,(long)(int)size * 0x50);
  pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,0);
  local_150 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
  uVar6 = local_148._16_8_;
  HVar8 = IncLRU((dgPolyhedra *)local_148._16_8_);
  local_100.m_tree = (dgTree<dgEdge,_long> *)uVar6;
  local_100.m_ptr =
       &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)uVar6)->super_dgRedBackNode;
  while (pdVar7 = local_100.m_ptr, (dgTreeNode *)local_100.m_ptr != (dgTreeNode *)0x0) {
    if (((dgEdge *)((long)local_100.m_ptr + 0x28))->m_mark != HVar8) {
      if (((dgEdge *)((long)local_100.m_ptr + 0x28))->m_incidentFace < 1) {
        pdVar15 = ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_twin;
        if (pdVar15->m_incidentFace < 1) {
          __assert_fail("edge->m_twin->m_incidentFace > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0x993,
                        "void CalculateAllMetrics(const dgPolyhedra *const, dgVertexCollapseVertexMetric *const, const dgBigVector *const)"
                       );
        }
        HVar2 = pdVar15->m_incidentVertex;
        HVar3 = pdVar15->m_next->m_incidentVertex;
        i2 = pdVar15->m_prev->m_incidentVertex;
        ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_mark = HVar8;
        UnboundedLoopPlane(&local_e8,HVar2,HVar3,i2,local_150);
        dgVertexCollapseVertexMetric::dgVertexCollapseVertexMetric(&local_88,&local_e8);
        dgVertexCollapseVertexMetric::Accumulate
                  (pdVar10 + ((dgEdge *)((long)pdVar7 + 0x28))->m_incidentVertex,&local_88);
        dgVertexCollapseVertexMetric::Accumulate
                  (pdVar10 + ((dgEdge *)((long)pdVar7 + 0x28))->m_twin->m_incidentVertex,&local_88);
      }
      else {
        EdgePlane(&local_e8,((dgEdge *)((long)local_100.m_ptr + 0x28))->m_incidentVertex,
                  ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_next->m_incidentVertex,
                  ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_prev->m_incidentVertex,local_150);
        dgVertexCollapseVertexMetric::dgVertexCollapseVertexMetric(&local_88,&local_e8);
        pdVar15 = (dgEdge *)((long)pdVar7 + 0x28);
        do {
          pdVar15->m_mark = HVar8;
          dgVertexCollapseVertexMetric::Accumulate(pdVar10 + pdVar15->m_incidentVertex,&local_88);
          pdVar15 = pdVar15->m_next;
        } while (pdVar15 != (dgEdge *)((long)pdVar7 + 0x28));
      }
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_100,0);
  }
  local_100.m_ptr = (dgRedBackNode *)0x0;
  local_100.m_tree = (dgTree<dgEdge,_long> *)local_148._16_8_;
  local_100.m_ptr =
       &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)local_148._16_8_)->super_dgRedBackNode
  ;
  local_150 = (dgBigVector *)((double)tol * (double)tol);
  while (pdVar7 = local_100.m_ptr, (dgTreeNode *)local_100.m_ptr != (dgTreeNode *)0x0) {
    ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_userData = 0;
    HVar8 = ((dgEdge *)((long)local_100.m_ptr + 0x28))->m_twin->m_incidentVertex;
    pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[]
                        (&local_120,((dgEdge *)((long)local_100.m_ptr + 0x28))->m_incidentVertex);
    pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,HVar8);
    dgBigVector::dgBigVector((dgBigVector *)&local_88,(HaF64 *)pdVar9);
    dgVector::dgVector((dgVector *)&local_e8,(dgBigVector *)&local_88);
    HVar20 = dgVertexCollapseVertexMetric::Evalue(pdVar10,(dgVector *)&local_e8);
    if ((double)HVar20 < (double)local_150) {
      pdVar16 = (dgPolyhedra *)local_148;
      pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
      HVar20 = EdgePenalty(pdVar16,pdVar9,(dgEdge *)((long)pdVar7 + 0x28));
      if (0.0 < (double)HVar20) {
        local_88.elem[0] = (HaF64)((ulong)local_88.elem[0] & 0xffffffff00000000);
        local_88.elem[1] = (HaF64)((long)pdVar7 + 0x28);
        local_158 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                              (&local_c0,(dgEdgeCollapseEdgeHandle *)&local_88);
        dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                  ((dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> *)&local_110,
                   &local_158,(double)HVar20);
        dgEdgeCollapseEdgeHandle::~dgEdgeCollapseEdgeHandle((dgEdgeCollapseEdgeHandle *)&local_88);
      }
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_100,0);
  }
LAB_00da1f2e:
  do {
    do {
      do {
        do {
          do {
            do {
              if (local_110.m_curCount == 0) {
                free(local_110.m_pool);
                free(local_98.super_dgStackBase.m_ptr);
                dgList<dgEdgeCollapseEdgeHandle>::~dgList(&local_c0);
                free(local_120.super_dgStackBase.m_ptr);
                free((void *)local_148._0_8_);
                return;
              }
              ppdVar11 = dgHeapBase<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::
                         operator[](&local_110,0);
              local_158 = *ppdVar11;
              pdVar15 = (local_158->m_info).m_edge;
              dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Pop
                        ((dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> *)
                         &local_110);
              dgList<dgEdgeCollapseEdgeHandle>::Remove(&local_c0,local_158);
            } while (pdVar15 == (dgEdge *)0x0);
            pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,0);
            pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
            CalculateVertexMetrics(pdVar10,pdVar9,pdVar15);
            HVar8 = pdVar15->m_twin->m_incidentVertex;
            pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[]
                                (&local_120,pdVar15->m_incidentVertex);
            pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,HVar8);
            local_88.elem[0] = (HaF64)(pdVar9->super_dgTemplateVector<double>).m_x;
            local_88.elem[1] = (HaF64)(pdVar9->super_dgTemplateVector<double>).m_y;
            local_88.elem[2] = (HaF64)(pdVar9->super_dgTemplateVector<double>).m_z;
            local_88.elem[3] = (HaF64)(pdVar9->super_dgTemplateVector<double>).m_w;
            dgVector::dgVector((dgVector *)&local_e8,(dgBigVector *)&local_88);
            HVar20 = dgVertexCollapseVertexMetric::Evalue(pdVar10,(dgVector *)&local_e8);
          } while ((double)local_150 <= (double)HVar20);
          pdVar16 = (dgPolyhedra *)local_148;
          pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)pdVar16,0);
          HVar20 = EdgePenalty(pdVar16,pdVar9,pdVar15);
        } while ((double)HVar20 <= 0.0);
        pdVar12 = pdVar15->m_twin;
        local_168 = pdVar12->m_prev->m_twin;
        pdVar19 = pdVar12->m_next;
      } while (local_168 == pdVar12 || local_168 == pdVar19);
      iVar1 = pdVar12->m_incidentVertex;
      iVar4 = pdVar15->m_incidentVertex;
    } while ((local_168 == pdVar15->m_next) &&
            (local_168 = pdVar15->m_prev->m_twin, local_168 == pdVar12 || local_168 == pdVar19));
    if (pdVar15->m_incidentFace < 0) {
      if (pdVar12->m_incidentFace < 0) goto LAB_00da19df;
      pdVar19 = pdVar19->m_twin;
      pdVar14 = pdVar15;
    }
    else if (pdVar12->m_incidentFace < 0) {
LAB_00da19df:
      pdVar14 = pdVar15->m_prev->m_twin;
      pdVar19 = pdVar12;
    }
    else {
      pdVar19 = pdVar19->m_twin;
      pdVar14 = pdVar15->m_prev->m_twin;
    }
    for (; uVar6 = local_148._16_8_, pdVar19 = pdVar19->m_next, pdVar19 != pdVar14;
        pdVar19 = pdVar19->m_twin) {
      pdVar12 = FindEdge((dgPolyhedra *)local_148._16_8_,pdVar12->m_incidentVertex,
                         pdVar19->m_twin->m_incidentVertex);
      if (pdVar12 != (dgEdge *)0x0) goto LAB_00da1f2e;
      pdVar12 = pdVar15->m_twin;
    }
    pdVar19 = pdVar12->m_next;
    pdVar14 = pdVar12->m_prev;
    if (pdVar19 == pdVar14->m_prev) {
      pdVar19 = pdVar19->m_twin;
      pdVar14->m_twin->m_twin = pdVar19;
      pdVar19->m_twin = pdVar14->m_twin;
      RemoveHalfEdge((dgPolyhedra *)local_148._16_8_,pdVar14);
      RemoveHalfEdge((dgPolyhedra *)uVar6,pdVar12->m_next);
    }
    else {
      pdVar19->m_prev = pdVar14;
      pdVar12->m_prev->m_next = pdVar19;
    }
    pdVar19 = pdVar15->m_next;
    pdVar14 = pdVar15->m_prev;
    if (pdVar19 == pdVar14->m_prev) {
      pdVar14 = pdVar14->m_twin;
      pdVar19->m_twin->m_twin = pdVar14;
      pdVar14->m_twin = pdVar19->m_twin;
      RemoveHalfEdge((dgPolyhedra *)uVar6,pdVar19);
      RemoveHalfEdge((dgPolyhedra *)uVar6,pdVar15->m_prev);
    }
    else {
      pdVar19->m_prev = pdVar14;
      pdVar15->m_prev->m_next = pdVar19;
    }
    if (pdVar12->m_twin->m_incidentVertex != iVar4) {
      __assert_fail("twin->m_twin->m_incidentVertex == v0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xaa0,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
    }
    if (pdVar15->m_twin->m_incidentVertex != iVar1) {
      __assert_fail("edge->m_twin->m_incidentVertex == v1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xaa1,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
    }
    RemoveHalfEdge((dgPolyhedra *)uVar6,pdVar12);
    RemoveHalfEdge((dgPolyhedra *)uVar6,pdVar15);
    pdVar15 = local_168;
    do {
      pdVar13 = dgTree<dgEdge,_long>::Find
                          ((dgTree<dgEdge,_long> *)uVar6,
                           (long)pdVar15->m_twin->m_incidentVertex | (long)iVar4 << 0x20);
      if ((pdVar13 != (dgTreeNode *)0x0) && (&pdVar13->m_info == pdVar15)) {
        iVar5 = pdVar15->m_twin->m_incidentVertex;
        pdVar15->m_incidentVertex = iVar1;
        pdVar13 = dgTree<dgEdge,_long>::ReplaceKey
                            ((dgTree<dgEdge,_long> *)uVar6,pdVar13,(long)iVar5 | (long)iVar1 << 0x20
                            );
        if (pdVar13 == (dgTreeNode *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xaaf,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
        }
      }
      pdVar13 = dgTree<dgEdge,_long>::Find
                          ((dgTree<dgEdge,_long> *)uVar6,
                           (ulong)(uint)pdVar15->m_twin->m_incidentVertex << 0x20 | (long)iVar4);
      pdVar12 = pdVar15->m_twin;
      if ((pdVar13 != (dgTreeNode *)0x0) && (&pdVar13->m_info == pdVar12)) {
        pdVar13 = dgTree<dgEdge,_long>::ReplaceKey
                            ((dgTree<dgEdge,_long> *)uVar6,pdVar13,
                             (ulong)(uint)pdVar12->m_incidentVertex << 0x20 | (long)iVar1);
        if (pdVar13 == (dgTreeNode *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xab9,"dgEdge *CollapseEdge(dgPolyhedra *const, dgEdge *const)");
        }
        pdVar12 = pdVar15->m_twin;
      }
      pdVar15 = pdVar12->m_next;
    } while (pdVar15 != local_168);
    if (local_168 != (dgEdge *)0x0) {
      pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,0);
      pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
      CalculateVertexMetrics(pdVar10,pdVar9,local_168);
      uVar6 = local_148._16_8_;
      pdVar15 = local_168;
      do {
        pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,0);
        pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,0);
        CalculateVertexMetrics(pdVar10,pdVar9,pdVar15->m_twin);
        pdVar15 = pdVar15->m_twin->m_next;
      } while (pdVar15 != local_168);
      HVar8 = IncLRU((dgPolyhedra *)uVar6);
      element = (dgEdgeCollapseEdgeHandle *)(local_148 + 0x18);
      pdVar15 = local_168;
      do {
        if (pdVar15->m_mark == HVar8) {
          __assert_fail("ptr->m_mark != mark",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xb1f,
                        "void dgPolyhedra::Optimize(const hacd::HaF64 *const, hacd::HaI32, hacd::HaF64)"
                       );
        }
        pdVar15->m_mark = HVar8;
        HVar2 = pdVar15->m_twin->m_incidentVertex;
        pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[]
                            (&local_120,pdVar15->m_incidentVertex);
        pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,HVar2);
        local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
             (pdVar9->super_dgTemplateVector<double>).m_x;
        local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
             (pdVar9->super_dgTemplateVector<double>).m_y;
        local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
             (pdVar9->super_dgTemplateVector<double>).m_z;
        local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
             (pdVar9->super_dgTemplateVector<double>).m_w;
        dgVector::dgVector((dgVector *)element,&local_e8.super_dgBigVector);
        HVar20 = dgVertexCollapseVertexMetric::Evalue(pdVar10,(dgVector *)element);
        if ((double)local_150 <= (double)HVar20) {
LAB_00da1cea:
          if (pdVar15->m_userData != 0) {
            *(undefined8 *)(pdVar15->m_userData + 8) = 0;
          }
          pdVar15->m_userData = 0;
        }
        else {
          pdVar16 = (dgPolyhedra *)local_148;
          pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)pdVar16,0);
          HVar20 = EdgePenalty(pdVar16,pdVar9,pdVar15);
          if ((double)HVar20 <= 0.0) goto LAB_00da1cea;
          local_148._24_4_ = 0;
          local_128 = pdVar15;
          local_158 = dgList<dgEdgeCollapseEdgeHandle>::Addtop(&local_c0,element);
          dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                    ((dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> *)
                     &local_110,&local_158,(double)HVar20);
          dgEdgeCollapseEdgeHandle::~dgEdgeCollapseEdgeHandle(element);
        }
        pdVar15 = pdVar15->m_twin->m_next;
        pdVar12 = local_168;
      } while (pdVar15 != local_168);
      do {
        pdVar15 = pdVar12->m_twin;
        pdVar19 = pdVar15;
        local_a0 = pdVar12;
        do {
          pdVar12 = pdVar19->m_twin;
          HVar2 = pdVar19->m_incidentVertex;
          HVar3 = pdVar12->m_incidentVertex;
          if (pdVar19->m_mark != HVar8) {
            pdVar19->m_mark = HVar8;
            pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,HVar2);
            pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,HVar3);
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 (pdVar9->super_dgTemplateVector<double>).m_x;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 (pdVar9->super_dgTemplateVector<double>).m_y;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 (pdVar9->super_dgTemplateVector<double>).m_z;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 (pdVar9->super_dgTemplateVector<double>).m_w;
            dgVector::dgVector((dgVector *)(local_148 + 0x18),&local_e8.super_dgBigVector);
            HVar20 = dgVertexCollapseVertexMetric::Evalue(pdVar10,(dgVector *)(local_148 + 0x18));
            if ((double)local_150 <= (double)HVar20) {
LAB_00da1dfe:
              if (pdVar19->m_userData != 0) {
                *(undefined8 *)(pdVar19->m_userData + 8) = 0;
              }
              pdVar19->m_userData = 0;
            }
            else {
              pdVar16 = (dgPolyhedra *)local_148;
              pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)pdVar16,0);
              HVar20 = EdgePenalty(pdVar16,pdVar9,pdVar19);
              if ((double)HVar20 <= 0.0) goto LAB_00da1dfe;
              local_148._24_4_ = 0;
              local_128 = pdVar19;
              local_f0 = (double)HVar20;
              local_158 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                    (&local_c0,(dgEdgeCollapseEdgeHandle *)(local_148 + 0x18));
              dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                        ((dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> *)
                         &local_110,&local_158,local_f0);
              dgEdgeCollapseEdgeHandle::~dgEdgeCollapseEdgeHandle
                        ((dgEdgeCollapseEdgeHandle *)(local_148 + 0x18));
            }
            pdVar12 = pdVar19->m_twin;
          }
          if (pdVar12->m_mark != HVar8) {
            pdVar12->m_mark = HVar8;
            pdVar10 = dgStack<dgVertexCollapseVertexMetric>::operator[](&local_120,HVar3);
            pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)local_148,HVar2);
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 (pdVar9->super_dgTemplateVector<double>).m_x;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 (pdVar9->super_dgTemplateVector<double>).m_y;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 (pdVar9->super_dgTemplateVector<double>).m_z;
            local_e8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 (pdVar9->super_dgTemplateVector<double>).m_w;
            dgVector::dgVector((dgVector *)(local_148 + 0x18),&local_e8.super_dgBigVector);
            HVar20 = dgVertexCollapseVertexMetric::Evalue(pdVar10,(dgVector *)(local_148 + 0x18));
            if ((double)HVar20 < (double)local_150) {
              pdVar16 = (dgPolyhedra *)local_148;
              pdVar9 = dgStack<dgBigVector>::operator[]((dgStack<dgBigVector> *)pdVar16,0);
              HVar20 = EdgePenalty(pdVar16,pdVar9,pdVar19->m_twin);
              if (0.0 < (double)HVar20) {
                local_128 = pdVar19->m_twin;
                local_148._24_4_ = 0;
                local_f0 = (double)HVar20;
                local_158 = dgList<dgEdgeCollapseEdgeHandle>::Addtop
                                      (&local_c0,(dgEdgeCollapseEdgeHandle *)(local_148 + 0x18));
                dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double>::Push
                          ((dgDownHeap<dgList<dgEdgeCollapseEdgeHandle>::dgListNode_*,_double> *)
                           &local_110,&local_158,local_f0);
                dgEdgeCollapseEdgeHandle::~dgEdgeCollapseEdgeHandle
                          ((dgEdgeCollapseEdgeHandle *)(local_148 + 0x18));
                pdVar12 = pdVar19->m_twin;
                goto LAB_00da1f05;
              }
            }
            pdVar12 = pdVar19->m_twin;
            if (pdVar12->m_userData != 0) {
              *(undefined8 *)(pdVar12->m_userData + 8) = 0;
            }
            pdVar12->m_userData = 0;
          }
LAB_00da1f05:
          pdVar19 = pdVar12->m_next;
        } while (pdVar19 != pdVar15);
        pdVar12 = local_a0->m_twin->m_next;
      } while (pdVar12 != local_168);
    }
  } while( true );
}

Assistant:

void dgPolyhedra::Optimize (const hacd::HaF64* const array, hacd::HaI32 strideInBytes, hacd::HaF64 tol)
{
	dgList <dgEdgeCollapseEdgeHandle>::dgListNode *handleNodePtr;

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	hacd::HaI32 edgeCount = GetEdgeCount() * 4 + 1024 * 16;
	hacd::HaI32 maxVertexIndex = GetLastVertexIndex();

	dgStack<dgBigVector> vertexPool (maxVertexIndex); 
	dgStack<dgVertexCollapseVertexMetric> vertexMetrics (maxVertexIndex + 512); 

	dgList <dgEdgeCollapseEdgeHandle> edgeHandleList;
	dgStack<char> heapPool (2 * edgeCount * hacd::HaI32 (sizeof (hacd::HaF64) + sizeof (dgEdgeCollapseEdgeHandle*) + sizeof (hacd::HaI32))); 
	dgDownHeap<dgList <dgEdgeCollapseEdgeHandle>::dgListNode* , hacd::HaF64> bigHeapArray(&heapPool[0], heapPool.GetSizeInBytes());

	NormalizeVertex (maxVertexIndex, &vertexPool[0], array, stride);
	memset (&vertexMetrics[0], 0, maxVertexIndex * sizeof (dgVertexCollapseVertexMetric));
	CalculateAllMetrics (this, &vertexMetrics[0], &vertexPool[0]);


	hacd::HaF64 tol2 = tol * tol;
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);

		edge->m_userData = 0;
		hacd::HaI32 index0 = edge->m_incidentVertex;
		hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;

		dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
		dgVector p	(&vertexPool[index1].m_x);
		hacd::HaF64 cost = metric.Evalue (p); 
		if (cost < tol2) {
			cost = EdgePenalty (&vertexPool[0], edge);

			if (cost > hacd::HaF64 (0.0f)) {
				dgEdgeCollapseEdgeHandle handle (edge);
				handleNodePtr = edgeHandleList.Addtop (handle);
				bigHeapArray.Push (handleNodePtr, cost);
			}
		}
	}


	while (bigHeapArray.GetCount()) {
		handleNodePtr = bigHeapArray[0];

		dgEdge* edge = handleNodePtr->GetInfo().m_edge;
		bigHeapArray.Pop();
		edgeHandleList.Remove (handleNodePtr);

		if (edge) {
			CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

			hacd::HaI32 index0 = edge->m_incidentVertex;
			hacd::HaI32 index1 = edge->m_twin->m_incidentVertex;
			dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
			dgBigVector p (vertexPool[index1]);

			if ((metric.Evalue (p) < tol2) && (EdgePenalty (&vertexPool[0], edge)  > hacd::HaF64 (0.0f))) {

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif

				edge = CollapseEdge(this, edge);

#ifdef __ENABLE_SANITY_CHECK 
				HACD_ASSERT (SanityCheck ());
#endif
				if (edge) {
					// Update vertex metrics
					CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], edge);

					// Update metrics for all surrounding vertex
					dgEdge* ptr = edge;
					do {
						CalculateVertexMetrics (&vertexMetrics[0], &vertexPool[0], ptr->m_twin);
						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);

					// calculate edge cost of all incident edges
					hacd::HaI32 mark = IncLRU();
					ptr = edge;
					do {
						HACD_ASSERT (ptr->m_mark != mark);
						ptr->m_mark = mark;

						index0 = ptr->m_incidentVertex;
						index1 = ptr->m_twin->m_incidentVertex;

						dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
						dgBigVector p (vertexPool[index1]);

						hacd::HaF64 cost = hacd::HaF32 (-1.0f);
						if (metric.Evalue (p) < tol2) {
							cost = EdgePenalty (&vertexPool[0], ptr);
						}

						if (cost  > hacd::HaF64 (0.0f)) {
							dgEdgeCollapseEdgeHandle handle (ptr);
							handleNodePtr = edgeHandleList.Addtop (handle);
							bigHeapArray.Push (handleNodePtr, cost);
						} else {
							dgEdgeCollapseEdgeHandle* const handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr->m_userData);
							if (handle) {
								handle->m_edge = NULL;
							}
							ptr->m_userData = hacd::HaU64 (NULL);

						}

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);


					// calculate edge cost of all incident edges to a surrounding vertex
					ptr = edge;
					do {
						dgEdge* const incidentEdge = ptr->m_twin;		

						dgEdge* ptr1 = incidentEdge;
						do {
							index0 = ptr1->m_incidentVertex;
							index1 = ptr1->m_twin->m_incidentVertex;

							if (ptr1->m_mark != mark) {
								ptr1->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index0];
								dgBigVector p (vertexPool[index1]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*)IntToPointer (ptr1->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_userData = hacd::HaU64 (NULL);

								}
							}

							if (ptr1->m_twin->m_mark != mark) {
								ptr1->m_twin->m_mark = mark;
								dgVertexCollapseVertexMetric &metric = vertexMetrics[index1];
								dgBigVector p (vertexPool[index0]);

								hacd::HaF64 cost = hacd::HaF32 (-1.0f);
								if (metric.Evalue (p) < tol2) {
									cost = EdgePenalty (&vertexPool[0], ptr1->m_twin);
								}

								if (cost  > hacd::HaF64 (0.0f)) {
									HACD_ASSERT (cost > hacd::HaF64(0.0f));
									dgEdgeCollapseEdgeHandle handle (ptr1->m_twin);
									handleNodePtr = edgeHandleList.Addtop (handle);
									bigHeapArray.Push (handleNodePtr, cost);
								} else {
									dgEdgeCollapseEdgeHandle *handle;
									handle = (dgEdgeCollapseEdgeHandle*) IntToPointer (ptr1->m_twin->m_userData);
									if (handle) {
										handle->m_edge = NULL;
									}
									ptr1->m_twin->m_userData = hacd::HaU64 (NULL);

								}
							}

							ptr1 = ptr1->m_twin->m_next;
						} while (ptr1 != incidentEdge);

						ptr = ptr->m_twin->m_next;
					} while (ptr != edge);
				}
			}
		}
	}
}